

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

completion * __thiscall
mjs::interpreter::impl::operator()
          (completion *__return_storage_ptr__,impl *this,return_statement *s)

{
  expression *e;
  value res;
  value local_60;
  value local_38;
  
  res.type_ = undefined;
  e = (s->e_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
      _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
      super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
  if (e != (expression *)0x0) {
    eval(&local_60,this,e);
    get_value(&local_38,this,&local_60);
    value::operator=(&res,&local_38);
    value::~value(&local_38);
    value::~value(&local_60);
  }
  completion::completion(__return_storage_ptr__,&res,return_);
  value::~value(&res);
  return __return_storage_ptr__;
}

Assistant:

void operator()(const variable_statement& s) {
        for (const auto& d: s.l()) {
            ids_.push_back(d.id());
        }
    }